

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.h
# Opt level: O1

void __thiscall
TPZFrontMatrix<std::complex<double>,_TPZFileEqnStorage<std::complex<double>_>,_TPZFrontNonSym<std::complex<double>_>_>
::TPZFrontMatrix(TPZFrontMatrix<std::complex<double>,_TPZFileEqnStorage<std::complex<double>_>,_TPZFrontNonSym<std::complex<double>_>_>
                 *this,void **vtt,
                TPZFrontMatrix<std::complex<double>,_TPZFileEqnStorage<std::complex<double>_>,_TPZFrontNonSym<std::complex<double>_>_>
                *cp)

{
  int64_t iVar1;
  char cVar2;
  
  (this->super_TPZAbstractFrontMatrix<std::complex<double>_>).super_TPZMatrix<std::complex<double>_>
  .super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable = (_func_int **)vtt[4];
  (this->super_TPZAbstractFrontMatrix<std::complex<double>_>).super_TPZMatrix<std::complex<double>_>
  .super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable = (_func_int **)vtt[3];
  iVar1 = (cp->super_TPZAbstractFrontMatrix<std::complex<double>_>).
          super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol;
  (this->super_TPZAbstractFrontMatrix<std::complex<double>_>).super_TPZMatrix<std::complex<double>_>
  .super_TPZBaseMatrix.fRow =
       (cp->super_TPZAbstractFrontMatrix<std::complex<double>_>).
       super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow;
  (this->super_TPZAbstractFrontMatrix<std::complex<double>_>).super_TPZMatrix<std::complex<double>_>
  .super_TPZBaseMatrix.fCol = iVar1;
  cVar2 = (cp->super_TPZAbstractFrontMatrix<std::complex<double>_>).
          super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fDefPositive;
  (this->super_TPZAbstractFrontMatrix<std::complex<double>_>).super_TPZMatrix<std::complex<double>_>
  .super_TPZBaseMatrix.fDecomposed =
       (cp->super_TPZAbstractFrontMatrix<std::complex<double>_>).
       super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fDecomposed;
  (this->super_TPZAbstractFrontMatrix<std::complex<double>_>).super_TPZMatrix<std::complex<double>_>
  .super_TPZBaseMatrix.fDefPositive = cVar2;
  (this->super_TPZAbstractFrontMatrix<std::complex<double>_>).super_TPZMatrix<std::complex<double>_>
  .super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable = (_func_int **)vtt[2];
  (this->super_TPZAbstractFrontMatrix<std::complex<double>_>).super_TPZMatrix<std::complex<double>_>
  .super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable = (_func_int **)vtt[1];
  (this->super_TPZAbstractFrontMatrix<std::complex<double>_>).super_TPZMatrix<std::complex<double>_>
  .super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable = (_func_int **)*vtt;
  TPZFileEqnStorage<std::complex<double>_>::TPZFileEqnStorage(&this->fStorage,&cp->fStorage);
  TPZFrontNonSym<std::complex<double>_>::TPZFrontNonSym(&this->fFront,&cp->fFront);
  iVar1 = cp->fLastDecomposed;
  this->fNumEq = cp->fNumEq;
  this->fLastDecomposed = iVar1;
  TPZVec<int>::TPZVec(&this->fNumElConnected,&cp->fNumElConnected);
  TPZVec<int>::TPZVec(&this->fNumElConnectedBackup,&cp->fNumElConnectedBackup);
  return;
}

Assistant:

TPZFrontMatrix(const TPZFrontMatrix &cp) : TPZRegisterClassId(&TPZFrontMatrix::ClassId),TPZAbstractFrontMatrix<TVar>(cp), fStorage(cp.fStorage),
	fFront(cp.fFront),fNumEq(cp.fNumEq),fLastDecomposed(cp.fLastDecomposed), fNumElConnected(cp.fNumElConnected),fNumElConnectedBackup(cp.fNumElConnectedBackup)
    {
    }